

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_ringbuf.c
# Opt level: O0

adt_buf_err_t adt_rbfh_remove(adt_rbfh_t *self,uint8_t *u8Data)

{
  byte bVar1;
  ushort uVar2;
  uint8_t *puVar3;
  uint8_t *u8EndPtr;
  uint8_t *u8Data_local;
  adt_rbfh_t *self_local;
  
  puVar3 = self->u8AllocBuf;
  uVar2 = self->u16AllocLen;
  bVar1 = self->u8ElemSize;
  if (self->u16NumElem == 0) {
    self_local._7_1_ = '\x03';
  }
  else {
    memcpy(u8Data,self->u8ReadPtr,(ulong)self->u8ElemSize);
    self->u8ReadPtr = self->u8ReadPtr + (int)(uint)self->u8ElemSize;
    if (self->u8ReadPtr == puVar3 + (uint)uVar2 * (uint)bVar1) {
      self->u8ReadPtr = self->u8AllocBuf;
    }
    self->u16NumElem = self->u16NumElem - 1;
    self_local._7_1_ = '\0';
  }
  return self_local._7_1_;
}

Assistant:

adt_buf_err_t adt_rbfh_remove(adt_rbfh_t* self, uint8_t* u8Data)
{
   uint8_t* u8EndPtr = self->u8AllocBuf + (self->u16AllocLen * ((uint32_t)self->u8ElemSize));

   if (self->u16NumElem == 0)
   {
      return BUF_E_UNDERFLOW;
   }
   memcpy(u8Data, self->u8ReadPtr, (size_t) self->u8ElemSize);
   self->u8ReadPtr+=self->u8ElemSize;
   if (self->u8ReadPtr == u8EndPtr)
   {
      self->u8ReadPtr = self->u8AllocBuf;
   }
   self->u16NumElem--;
   return BUF_E_OK;
}